

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomPoints>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomPoints *points
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop_name;
  string *psVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  size_type sVar5;
  mapped_type *this;
  _Base_ptr p_Var6;
  Property *pPVar7;
  _Base_ptr p_Var8;
  int iVar9;
  undefined4 in_stack_fffffffffffffc9c;
  allocator local_359;
  string *local_358;
  _Base_ptr local_350;
  Property *local_348;
  ParseResult ret;
  string local_318;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2f8;
  string *local_2f0;
  string *local_2e8;
  string *local_2e0;
  string *local_2d8;
  string *local_2d0;
  _Base_ptr local_2c8;
  string *local_2c0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  ostringstream ss_e;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar3 = (uint)options->strict_allowedToken_check;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&table,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&points->super_GPrim,warn,err,options->strict_allowedToken_check)
  ;
  if (bVar2) {
    local_2c8 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_2c0 = (string *)&points->points;
    local_2d0 = (string *)&points->normals;
    local_2d8 = (string *)&points->widths;
    local_2e0 = (string *)&points->ids;
    local_2e8 = (string *)&points->velocities;
    p_Var6 = (_Base_ptr)&points->accelerations;
    local_2f8 = &(points->super_GPrim).props;
    p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_358 = err;
    local_2f0 = (string *)p_Var6;
    while( true ) {
      local_348 = (Property *)
                  CONCAT44(local_348._4_4_,
                           (int)CONCAT71((int7)((ulong)p_Var6 >> 8),p_Var8 == local_2c8));
      if (p_Var8 == local_2c8) break;
      local_350 = p_Var8 + 1;
      ::std::__cxx11::string::string(local_1c8,(string *)local_350);
      prop_name = (Property *)(p_Var8 + 2);
      ::std::__cxx11::string::string((string *)&ss_e,"points",(allocator *)&local_318);
      pPVar7 = (Property *)&ss_e;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                (&ret,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c8,(string *)prop_name,(Property *)&ss_e,local_2c0,
                 (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc9c,uVar3));
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar9 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        bVar2 = false;
        iVar9 = 3;
      }
      else {
        bVar2 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd88);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_359);
          fmt::format<char[7],std::__cxx11::string>
                    (&local_318,(fmt *)&local_288,(string *)"points",(char (*) [7])&ret.err,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar7);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_318);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_358;
          if (local_358 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_318,&local_288,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_318);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar2 = false;
          iVar9 = 1;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar2) {
        ::std::__cxx11::string::string(local_1e8,(string *)local_350);
        ::std::__cxx11::string::string((string *)&ss_e,"normals",(allocator *)&local_318);
        pPVar7 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1e8,(string *)prop_name,(Property *)&ss_e,local_2d0,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc9c,uVar3));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar9 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar9 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd89);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_359);
            fmt::format<char[8],std::__cxx11::string>
                      (&local_318,(fmt *)&local_288,(string *)"normals",(char (*) [8])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar7);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_318);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar1 = local_358;
            if (local_358 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_318,&local_288,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar1);
              ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_318);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar9 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b6da2;
        ::std::__cxx11::string::string(local_208,(string *)local_350);
        ::std::__cxx11::string::string((string *)&ss_e,"widths",(allocator *)&local_318);
        pPVar7 = (Property *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_208,(string *)prop_name,(Property *)&ss_e,local_2d8,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc9c,uVar3));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar9 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar9 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd8a);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_359);
            fmt::format<char[7],std::__cxx11::string>
                      (&local_318,(fmt *)&local_288,(string *)"widths",(char (*) [7])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar7);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_318);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar1 = local_358;
            if (local_358 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_318,&local_288,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar1);
              ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_318);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar9 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b6da2;
        ::std::__cxx11::string::string(local_228,(string *)local_350);
        ::std::__cxx11::string::string((string *)&ss_e,"ids",(allocator *)&local_318);
        pPVar7 = (Property *)&ss_e;
        (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_228,(string *)prop_name,(Property *)&ss_e,local_2e0,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc9c,uVar3));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar9 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar9 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd8b);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_359);
            fmt::format<char[4],std::__cxx11::string>
                      (&local_318,(fmt *)&local_288,(string *)"ids",(char (*) [4])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar7);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_318);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar1 = local_358;
            if (local_358 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_318,&local_288,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar1);
              ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_318);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar9 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b6da2;
        ::std::__cxx11::string::string(local_248,(string *)local_350);
        ::std::__cxx11::string::string((string *)&ss_e,"velocities",(allocator *)&local_318);
        pPVar7 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_248,(string *)prop_name,(Property *)&ss_e,local_2e8,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc9c,uVar3));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar9 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar9 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd8c);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_359);
            fmt::format<char[11],std::__cxx11::string>
                      (&local_318,(fmt *)&local_288,(string *)"velocities",(char (*) [11])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar7);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_318);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar1 = local_358;
            if (local_358 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_318,&local_288,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar1);
              ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_318);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar9 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar2) goto LAB_001b6da2;
        ::std::__cxx11::string::string(local_268,(string *)local_350);
        ::std::__cxx11::string::string((string *)&ss_e,"accelerations",(allocator *)&local_318);
        pPVar7 = (Property *)&ss_e;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  (&ret,(_anonymous_namespace_ *)&table,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_268,(string *)prop_name,(Property *)&ss_e,local_2f0,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc9c,uVar3));
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar9 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar2 = false;
          iVar9 = 3;
        }
        else {
          bVar2 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar4 = ::std::operator<<(poVar4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar4 = ::std::operator<<(poVar4,":");
            poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
            poVar4 = ::std::operator<<(poVar4,"():");
            poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd8d);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::string
                      ((string *)&local_288,"Parsing attribute `{}` failed. Error: {}",&local_359);
            fmt::format<char[14],std::__cxx11::string>
                      (&local_318,(fmt *)&local_288,(string *)"accelerations",
                       (char (*) [14])&ret.err,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar7);
            poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&local_318);
            ::std::operator<<(poVar4,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar1 = local_358;
            if (local_358 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_318,&local_288,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar1);
              ::std::__cxx11::string::operator=((string *)psVar1,(string *)&local_318);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar2 = false;
            iVar9 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        p_Var6 = local_350;
        if (!bVar2) goto LAB_001b6da2;
        local_348 = prop_name;
        sVar5 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)local_350);
        if (sVar5 == 0) {
          this = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                 ::operator[](local_2f8,(key_type *)p_Var6);
          Property::operator=(this,local_348);
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var6);
        }
        sVar5 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)p_Var6);
        if (sVar5 == 0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xd8f);
          ::std::operator<<(poVar4," ");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var6);
          poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_358;
          if (local_358 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_318,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          goto LAB_001b6ed8;
        }
      }
      else {
LAB_001b6da2:
        if ((iVar9 != 3) && (iVar9 != 0)) break;
      }
      p_Var6 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
      p_Var8 = p_Var6;
    }
  }
  else {
LAB_001b6ed8:
    local_348 = (Property *)((ulong)local_348 & 0xffffffff00000000);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return SUB81(local_348,0);
}

Assistant:

bool ReconstructPrim<GeomPoints>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomPoints *points,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct Points.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, points, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("prop: " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomPoints, points->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomPoints, points->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomPoints, points->widths)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ids", GeomPoints, points->ids)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomPoints, points->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomPoints, points->accelerations)
    ADD_PROPERTY(table, prop, GeomSphere, points->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}